

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

NewOrderSingle * __thiscall
Application::queryNewOrderSingle50(NewOrderSingle *__return_storage_ptr__,Application *this)

{
  char cVar1;
  OrdType *aOrdType;
  Header *header;
  StopPx local_400;
  Price local_3a8;
  TimeInForce local_350;
  OrderQty local_2f8;
  Symbol local_2a0;
  CHAR local_241;
  HandlInst local_240;
  OrdType local_1e8;
  TransactTime local_190;
  Side local_138;
  ClOrdID local_d0;
  undefined1 local_71;
  undefined1 local_70 [8];
  OrdType ordType;
  Application *this_local;
  NewOrderSingle *newOrderSingle;
  
  ordType.super_CharField.super_FieldBase.m_metrics = (field_metrics)this;
  FIX::OrdType::OrdType((OrdType *)local_70);
  local_71 = 0;
  queryClOrdID(&local_d0,this);
  querySide(&local_138,this);
  FIX::TransactTime::TransactTime(&local_190);
  queryOrdType(&local_1e8,this);
  aOrdType = FIX::OrdType::operator=((OrdType *)local_70,&local_1e8);
  FIX50::NewOrderSingle::NewOrderSingle
            (__return_storage_ptr__,&local_d0,&local_138,&local_190,aOrdType);
  FIX::OrdType::~OrdType(&local_1e8);
  FIX::TransactTime::~TransactTime(&local_190);
  FIX::Side::~Side(&local_138);
  FIX::ClOrdID::~ClOrdID(&local_d0);
  local_241 = '1';
  FIX::HandlInst::HandlInst(&local_240,&local_241);
  FIX50::NewOrderSingle::set(__return_storage_ptr__,&local_240);
  FIX::HandlInst::~HandlInst(&local_240);
  querySymbol(&local_2a0,this);
  FIX50::NewOrderSingle::set(__return_storage_ptr__,&local_2a0);
  FIX::Symbol::~Symbol(&local_2a0);
  queryOrderQty(&local_2f8,this);
  FIX50::NewOrderSingle::set(__return_storage_ptr__,&local_2f8);
  FIX::OrderQty::~OrderQty(&local_2f8);
  queryTimeInForce(&local_350,this);
  FIX50::NewOrderSingle::set(__return_storage_ptr__,&local_350);
  FIX::TimeInForce::~TimeInForce(&local_350);
  cVar1 = FIX::CharField::operator_cast_to_char((CharField *)local_70);
  if ((cVar1 == '2') ||
     (cVar1 = FIX::CharField::operator_cast_to_char((CharField *)local_70), cVar1 == '4')) {
    queryPrice(&local_3a8,this);
    FIX50::NewOrderSingle::set(__return_storage_ptr__,&local_3a8);
    FIX::Price::~Price(&local_3a8);
  }
  cVar1 = FIX::CharField::operator_cast_to_char((CharField *)local_70);
  if ((cVar1 == '3') ||
     (cVar1 = FIX::CharField::operator_cast_to_char((CharField *)local_70), cVar1 == '4')) {
    queryStopPx(&local_400,this);
    FIX50::NewOrderSingle::set(__return_storage_ptr__,&local_400);
    FIX::StopPx::~StopPx(&local_400);
  }
  header = FIX50::Message::getHeader(&__return_storage_ptr__->super_Message);
  queryHeader(this,(Header *)header);
  local_71 = 1;
  FIX::OrdType::~OrdType((OrdType *)local_70);
  return __return_storage_ptr__;
}

Assistant:

FIX50::NewOrderSingle Application::queryNewOrderSingle50() {
  FIX::OrdType ordType;

  FIX50::NewOrderSingle newOrderSingle(queryClOrdID(), querySide(), FIX::TransactTime(), ordType = queryOrdType());

  newOrderSingle.set(FIX::HandlInst('1'));
  newOrderSingle.set(querySymbol());
  newOrderSingle.set(queryOrderQty());
  newOrderSingle.set(queryTimeInForce());
  if (ordType == FIX::OrdType_LIMIT || ordType == FIX::OrdType_STOP_LIMIT) {
    newOrderSingle.set(queryPrice());
  }
  if (ordType == FIX::OrdType_STOP || ordType == FIX::OrdType_STOP_LIMIT) {
    newOrderSingle.set(queryStopPx());
  }

  queryHeader(newOrderSingle.getHeader());
  return newOrderSingle;
}